

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdGetDescriptorMultisigKey
              (void *handle,void *descriptor_handle,uint32_t key_index,int *key_type,char **pubkey,
              char **ext_pubkey,char **ext_privkey)

{
  long *plVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  CfdException *this;
  char *work_ext_pubkey;
  char *work_pubkey;
  Pubkey pubkey_obj;
  DescriptorKeyData key_data;
  ExtPrivkey local_190;
  ExtPrivkey ext_privkey_obj;
  ExtPubkey ext_pubkey_obj;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ext_privkey_obj,"Descriptor",(allocator *)&local_190);
  cfd::capi::CheckBuffer(descriptor_handle,(string *)&ext_privkey_obj);
  std::__cxx11::string::~string((string *)&ext_privkey_obj);
  plVar1 = *(long **)((long)descriptor_handle + 0x20);
  if (plVar1 == (long *)0x0) {
LAB_00354dcd:
    ext_privkey_obj.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_address.cpp";
    ext_privkey_obj.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x2f4;
    ext_privkey_obj.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetDescriptorMultisigKey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&ext_privkey_obj,"key index is maximum over.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ext_privkey_obj,"Failed to parameter. key index is maximum over.",
               (allocator *)&local_190);
    cfd::core::CfdException::CfdException(this,kCfdOutOfRangeError,(string *)&ext_privkey_obj);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((ulong)((plVar1[1] - *plVar1) / 0x28) <= (ulong)key_index) goto LAB_00354dcd;
  cfd::DescriptorKeyData::DescriptorKeyData
            (&key_data,(DescriptorKeyData *)(*plVar1 + (ulong)key_index * 0x28));
  if (key_type != (int *)0x0) {
    *key_type = key_data.type;
  }
  cfd::core::Pubkey::Pubkey(&pubkey_obj);
  cfd::core::ExtPubkey::ExtPubkey(&ext_pubkey_obj);
  cfd::core::ExtPrivkey::ExtPrivkey(&ext_privkey_obj);
  if (key_data.type == kDescriptorKeyBip32) {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)&local_190,&key_data.key);
    cfd::core::ExtPubkey::operator=(&ext_pubkey_obj,(ExtPubkey *)&local_190);
    cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_190);
    cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_190,&ext_pubkey_obj);
LAB_00354c80:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj,&local_190);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_190);
  }
  else {
    if (key_data.type == kDescriptorKeyBip32Priv) {
      cfd::core::ExtPrivkey::ExtPrivkey(&local_190,&key_data.key);
      cfd::core::ExtPrivkey::operator=(&ext_privkey_obj,&local_190);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_190);
      cfd::core::ExtPrivkey::GetExtPubkey((ExtPubkey *)&local_190,&ext_privkey_obj);
      cfd::core::ExtPubkey::operator=(&ext_pubkey_obj,(ExtPubkey *)&local_190);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_190);
      cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_190,&ext_pubkey_obj);
      goto LAB_00354c80;
    }
    if (key_data.key._M_string_length != 0) {
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_190,&key_data.key);
      goto LAB_00354c80;
    }
  }
  if (pubkey == (char **)0x0) {
LAB_00354cda:
    pcVar3 = (char *)0x0;
  }
  else {
    bVar2 = cfd::core::Pubkey::IsValid(&pubkey_obj);
    if (!bVar2) goto LAB_00354cda;
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_190,&pubkey_obj);
    pcVar3 = cfd::capi::CreateString((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
  }
  if (ext_pubkey == (char **)0x0) {
LAB_00354d23:
    pcVar4 = (char *)0x0;
  }
  else {
    bVar2 = cfd::core::ExtPubkey::IsValid(&ext_pubkey_obj);
    if (!bVar2) goto LAB_00354d23;
    cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)&local_190,&ext_pubkey_obj);
    pcVar4 = cfd::capi::CreateString((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
  }
  if (ext_privkey != (char **)0x0) {
    bVar2 = cfd::core::ExtPrivkey::IsValid(&ext_privkey_obj);
    if (bVar2) {
      cfd::core::ExtPrivkey::ToString_abi_cxx11_((string *)&local_190,&ext_privkey_obj);
      pcVar5 = cfd::capi::CreateString((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      goto LAB_00354d71;
    }
  }
  pcVar5 = (char *)0x0;
LAB_00354d71:
  if (pcVar3 != (char *)0x0) {
    *pubkey = pcVar3;
  }
  if (pcVar4 != (char *)0x0) {
    *ext_pubkey = pcVar4;
  }
  if (pcVar5 != (char *)0x0) {
    *ext_privkey = pcVar5;
  }
  cfd::core::ExtPrivkey::~ExtPrivkey(&ext_privkey_obj);
  cfd::core::ExtPubkey::~ExtPubkey(&ext_pubkey_obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
  std::__cxx11::string::~string((string *)&key_data.key);
  return 0;
}

Assistant:

int CfdGetDescriptorMultisigKey(
    void* handle, void* descriptor_handle, uint32_t key_index, int* key_type,
    char** pubkey, char** ext_pubkey, char** ext_privkey) {
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->multisig_key_list == nullptr) ||
        (key_index >= buffer->multisig_key_list->size())) {
      warn(CFD_LOG_SOURCE, "key index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. key index is maximum over.");
    }

    DescriptorKeyData key_data = (*buffer->multisig_key_list)[key_index];
    if (key_type != nullptr) {
      *key_type = key_data.type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    switch (key_data.type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(key_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(key_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!key_data.key.empty()) pubkey_obj = Pubkey(key_data.key);
        break;
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }

    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_pubkey, &work_ext_pubkey, &work_ext_privkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_pubkey, &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_pubkey, &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}